

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::_InternalSerialize
          (RandomUniformStaticLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong *puVar1;
  void *data;
  bool bVar2;
  LogMessage *other;
  ulong uVar3;
  ulong uVar4;
  int size;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  byte *ptr;
  ulong *puVar8;
  size_t __n;
  byte *pbVar9;
  float fVar10;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar4 = this->seed_;
  ptr = target;
  if (uVar4 != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar4 = this->seed_;
    }
    *target = '\b';
    target[1] = (byte)uVar4;
    if (uVar4 < 0x80) {
      ptr = target + 2;
    }
    else {
      target[1] = (byte)uVar4 | 0x80;
      target[2] = (uint8_t)(uVar4 >> 7);
      ptr = target + 3;
      if (0x3fff < uVar4) {
        uVar5 = (ulong)target[2];
        uVar4 = uVar4 >> 7;
        do {
          ptr[-1] = (byte)uVar5 | 0x80;
          uVar3 = uVar4 >> 7;
          *ptr = (byte)uVar3;
          ptr = ptr + 1;
          uVar5 = uVar3 & 0xffffffff;
          bVar2 = 0x3fff < uVar4;
          uVar4 = uVar3;
        } while (bVar2);
      }
    }
  }
  fVar10 = this->minval_;
  if (fVar10 != 0.0) {
    if (stream->end_ <= ptr) {
      ptr = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
      fVar10 = this->minval_;
    }
    *ptr = 0x15;
    *(float *)(ptr + 1) = fVar10;
    ptr = ptr + 5;
  }
  fVar10 = this->maxval_;
  if (fVar10 != 0.0) {
    if (stream->end_ <= ptr) {
      ptr = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
      fVar10 = this->maxval_;
    }
    *ptr = 0x1d;
    *(float *)(ptr + 1) = fVar10;
    ptr = ptr + 5;
  }
  uVar7 = (this->_outputshape_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar7) {
    pbVar9 = stream->end_;
    if (pbVar9 <= ptr) {
      ptr = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
      pbVar9 = stream->end_;
    }
    if (pbVar9 <= ptr) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *ptr = 0x22;
    pbVar9 = ptr + 1;
    uVar6 = uVar7;
    if (0x7f < uVar7) {
      do {
        ptr = pbVar9;
        *ptr = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar9 = ptr + 1;
        bVar2 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar2);
    }
    ptr = ptr + 2;
    *pbVar9 = (byte)uVar7;
    puVar8 = (ulong *)(this->outputshape_).arena_or_elements_;
    puVar1 = puVar8 + (this->outputshape_).current_size_;
    do {
      if (stream->end_ <= ptr) {
        ptr = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
      }
      uVar4 = *puVar8;
      *ptr = (byte)uVar4;
      if (uVar4 < 0x80) {
        pbVar9 = ptr + 1;
      }
      else {
        *ptr = (byte)uVar4 | 0x80;
        ptr[1] = (byte)(uVar4 >> 7);
        pbVar9 = ptr + 2;
        if (0x3fff < uVar4) {
          uVar5 = (ulong)ptr[1];
          uVar4 = uVar4 >> 7;
          do {
            pbVar9[-1] = (byte)uVar5 | 0x80;
            uVar3 = uVar4 >> 7;
            *pbVar9 = (byte)uVar3;
            pbVar9 = pbVar9 + 1;
            uVar5 = uVar3 & 0xffffffff;
            bVar2 = 0x3fff < uVar4;
            uVar4 = uVar3;
          } while (bVar2);
        }
      }
      ptr = pbVar9;
      puVar8 = puVar8 + 1;
    } while (puVar8 < puVar1);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = uVar4 & 0xfffffffffffffffc;
    data = *(void **)(uVar4 + 8);
    size = (int)*(undefined8 *)(uVar4 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)ptr < (long)__n) {
      ptr = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,ptr);
    }
    else {
      memcpy(ptr,data,__n);
      ptr = ptr + __n;
    }
  }
  return ptr;
}

Assistant:

uint8_t* RandomUniformStaticLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.RandomUniformStaticLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 seed = 1;
  if (this->_internal_seed() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(1, this->_internal_seed(), target);
  }

  // float minVal = 2;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_minval = this->_internal_minval();
  uint32_t raw_minval;
  memcpy(&raw_minval, &tmp_minval, sizeof(tmp_minval));
  if (raw_minval != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(2, this->_internal_minval(), target);
  }

  // float maxVal = 3;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_maxval = this->_internal_maxval();
  uint32_t raw_maxval;
  memcpy(&raw_maxval, &tmp_maxval, sizeof(tmp_maxval));
  if (raw_maxval != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(3, this->_internal_maxval(), target);
  }

  // repeated uint64 outputShape = 4;
  {
    int byte_size = _outputshape_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          4, _internal_outputshape(), byte_size, target);
    }
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.RandomUniformStaticLayerParams)
  return target;
}